

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdKelvinTexShaderOp::emulate_mthd(MthdKelvinTexShaderOp *this)

{
  bool bVar1;
  MthdKelvinTexShaderOp *this_local;
  
  pgraph_kelvin_check_err19(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  pgraph_kelvin_check_err18(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
    bVar1 = ::nv04_pgraph_is_nv25p
                      (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest
                        .super_Test.chipset);
    if (bVar1) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_shader_op =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_shader_op &
           0xfff00000 | (this->super_SingleMthdTest).super_MthdTest.val & 0xfffff;
    }
    else {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_shader_op =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_shader_op &
           0xfffffff8 | (this->super_SingleMthdTest).super_MthdTest.val & 7;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_shader_op =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_shader_op &
           0xfff0001f |
           (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2c) >> 0x31) << 5);
    }
    pgraph_bundle(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x20,0,
                  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                  bundle_tex_shader_op,true);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		pgraph_kelvin_check_err18(&exp);
		if (!exp.nsource) {
			if (!nv04_pgraph_is_nv25p(&chipset)) {
				insrt(exp.bundle_tex_shader_op, 0, 3, extr(val, 0, 3));
				insrt(exp.bundle_tex_shader_op, 5, 15, extr(val, 5, 15));
			} else {
				insrt(exp.bundle_tex_shader_op, 0, 20, val);
			}
			pgraph_bundle(&exp, BUNDLE_TEX_SHADER_OP, 0, exp.bundle_tex_shader_op, true);
		}
	}